

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdSocket.cpp
# Opt level: O2

void __thiscall BaseSocketImpl::BaseSocketImpl(BaseSocketImpl *this,BaseSocketImpl *pBaseSocket)

{
  int32_t iVar1;
  int iVar2;
  _Bind<void_(BaseSocketImpl::*(BaseSocketImpl_*))()> local_48;
  
  this->_vptr_BaseSocketImpl = (_func_int **)&PTR__BaseSocketImpl_00145338;
  this->m_fSock = -1;
  (this->m_strName)._M_dataplus._M_p = (pointer)&(this->m_strName).field_2;
  (this->m_strName)._M_string_length = 0;
  (this->m_strName).field_2._M_local_buf[0] = '\0';
  (this->m_thListen)._M_id._M_thread = 0;
  (this->m_thWrite)._M_id._M_thread = 0;
  (this->m_mxWrite).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->m_mxWrite).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->m_mxWrite).super___mutex_base._M_mutex + 0x10) = 0;
  (this->m_mxWrite).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->m_mxWrite).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->m_thClose)._M_id._M_thread = 0;
  this->m_bStop = pBaseSocket->m_bStop;
  iVar2 = pBaseSocket->m_iErrLoc;
  this->m_iError = pBaseSocket->m_iError;
  this->m_iErrLoc = iVar2;
  (this->m_iShutDownState).super___atomic_base<unsigned_char>._M_i = '\0';
  local_48._M_f = 0x79;
  local_48._8_8_ = 0;
  local_48._M_bound_args.super__Tuple_impl<0UL,_BaseSocketImpl_*>.
  super__Head_base<0UL,_BaseSocketImpl_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_BaseSocketImpl_*>)(_Tuple_impl<0UL,_BaseSocketImpl_*>)this;
  std::function<void(BaseSocket*)>::
  function<std::_Bind<void(BaseSocketImpl::*(BaseSocketImpl*))()>,void>
            ((function<void(BaseSocket*)> *)&this->m_fError,&local_48);
  (this->m_fClosingParam).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->m_fClosingParam)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->m_fClosingParam).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->m_fClosingParam).super__Function_base._M_functor + 8) = 0;
  (this->m_fClosing).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->m_fClosing)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->m_fClosing).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->m_fClosing).super__Function_base._M_functor + 8) = 0;
  (this->m_fErrorParam).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->m_fErrorParam)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->m_fErrorParam).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->m_fErrorParam).super__Function_base._M_functor + 8) = 0;
  this->m_pvUserData = pBaseSocket->m_pvUserData;
  (this->m_mxFnClosing).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->m_mxFnClosing).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->m_mxFnClosing).super___mutex_base._M_mutex + 0x10) = 0;
  (this->m_mxFnClosing).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->m_mxFnClosing).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  this->m_pBkRef = (BaseSocket *)0x0;
  std::mutex::lock(&pBaseSocket->m_mxWrite);
  iVar1 = this->m_fSock;
  this->m_fSock = pBaseSocket->m_fSock;
  pBaseSocket->m_fSock = iVar1;
  std::function<void_(BaseSocket_*)>::swap(&this->m_fError,&pBaseSocket->m_fError);
  std::function<void_(BaseSocket_*,_void_*)>::swap(&this->m_fErrorParam,&pBaseSocket->m_fErrorParam)
  ;
  std::function<void_(BaseSocket_*)>::swap(&this->m_fClosing,&pBaseSocket->m_fClosing);
  std::function<void_(BaseSocket_*,_void_*)>::swap
            (&this->m_fClosingParam,&pBaseSocket->m_fClosingParam);
  LOCK();
  (this->m_iShutDownState).super___atomic_base<unsigned_char>._M_i =
       (pBaseSocket->m_iShutDownState).super___atomic_base<unsigned_char>._M_i;
  UNLOCK();
  pthread_mutex_unlock((pthread_mutex_t *)&pBaseSocket->m_mxWrite);
  return;
}

Assistant:

BaseSocketImpl::BaseSocketImpl(BaseSocketImpl* pBaseSocket) : m_fSock(INVALID_SOCKET), m_bStop(pBaseSocket->m_bStop), m_iError(pBaseSocket->m_iError), m_iErrLoc(pBaseSocket->m_iErrLoc), m_iShutDownState(0), m_fError(bind(&BaseSocketImpl::OnError, this)), m_pvUserData(pBaseSocket->m_pvUserData), m_pBkRef(nullptr)
{
    lock_guard<mutex> lock(pBaseSocket->m_mxWrite);
    swap(m_fSock, pBaseSocket->m_fSock);
    swap(m_fError, pBaseSocket->m_fError);
    swap(m_fErrorParam, pBaseSocket->m_fErrorParam);
    swap(m_fClosing, pBaseSocket->m_fClosing);
    swap(m_fClosingParam, pBaseSocket->m_fClosingParam);
    m_iShutDownState.exchange(pBaseSocket->m_iShutDownState);
}